

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O2

void Am_Register_Slot_Key(Am_Slot_Key key,char *string)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  
  verify_slot_name_key_table();
  iVar1 = Am_Symbol_Table::Get_Value(Am_Slot_Name_Key_Table,string);
  if (iVar1 == -1) {
    pcVar2 = Am_Symbol_Table::operator[](Am_Slot_Name_Key_Table,(uint)key);
    if (pcVar2 == (char *)0x0) {
      Am_Symbol_Table::Add_Item(Am_Slot_Name_Key_Table,(uint)key,string);
      return;
    }
    std::operator<<((ostream *)&std::cerr,"Slot Key, ");
    Am_Print_Key((ostream *)&std::cerr,key);
    pcVar2 = ", has already been used.";
    poVar3 = (ostream *)&std::cerr;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Slot Name, ");
    poVar3 = std::operator<<(poVar3,string);
    pcVar2 = ", has been overwritten.";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Error();
}

Assistant:

void
Am_Register_Slot_Key(Am_Slot_Key key, const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key != -1) {
    std::cerr << "Slot Name, " << string << ", has been overwritten."
              << std::endl;
    Am_Error();
  }
  const char *prev_name = Am_Slot_Name_Key_Table->Get_Key(key);
  if (prev_name) {
    std::cerr << "Slot Key, ";
    Am_Print_Key(std::cerr, key);
    std::cerr << ", has already been used." << std::endl;
    Am_Error();
  }
  Am_Slot_Name_Key_Table->Add_Item(key, string);
}